

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

void __thiscall features::Surf::descriptor_assignment(Surf *this)

{
  pointer *ppDVar1;
  pointer pDVar2;
  iterator __position;
  bool bVar3;
  pointer pKVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auStack_148 [8];
  Descriptor descr;
  
  descr.data.v._248_8_ = &this->descriptors;
  pDVar2 = (this->descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->descriptors).
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    (this->descriptors).
    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::reserve
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             descr.data.v._248_8_,
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pKVar4 = (this->keypoints).
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish != pKVar4) {
    lVar5 = 0xc;
    uVar6 = 0;
    do {
      auStack_148._0_4_ = *(float *)((long)pKVar4 + lVar5 + -4);
      auStack_148._4_4_ = *(float *)((long)&pKVar4->octave + lVar5);
      descr.x = ((float)(*(int *)((anonymous_namespace)::kernel_sizes +
                                 (long)(int)(*(float *)((long)pKVar4 + lVar5 + -8) + 0.5) * 4 +
                                 (long)*(int *)((long)pKVar4 + lVar5 + -0xc) * 0x10) * 3) * 1.2) /
                9.0;
      bVar3 = descriptor_orientation(this,(Descriptor *)auStack_148);
      if (bVar3) {
        bVar3 = descriptor_computation
                          (this,(Descriptor *)auStack_148,(this->options).use_upright_descriptor);
        if (bVar3) {
          __position._M_current =
               (this->descriptors).
               super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->descriptors).
              super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<features::Surf::Descriptor,std::allocator<features::Surf::Descriptor>>::
            _M_realloc_insert<features::Surf::Descriptor_const&>
                      ((vector<features::Surf::Descriptor,std::allocator<features::Surf::Descriptor>>
                        *)descr.data.v._248_8_,__position,(Descriptor *)auStack_148);
          }
          else {
            (__position._M_current)->x = (float)auStack_148._0_4_;
            (__position._M_current)->y = (float)auStack_148._4_4_;
            (__position._M_current)->scale = descr.x;
            (__position._M_current)->orientation = descr.y;
            memmove(&(__position._M_current)->data,&descr.scale,0x100);
            ppDVar1 = &(this->descriptors).
                       super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppDVar1 = *ppDVar1 + 1;
          }
        }
      }
      uVar6 = uVar6 + 1;
      pKVar4 = (this->keypoints).
               super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->keypoints).
                                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4 >> 4));
  }
  return;
}

Assistant:

void
Surf::descriptor_assignment (void)
{
    this->descriptors.clear();
    this->descriptors.reserve(keypoints.size());
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint const& kp = this->keypoints[i];

        /* Copy over the basic information to the descriptor. */
        Descriptor descr;
        descr.x = kp.x;
        descr.y = kp.y;

        /*
         * The scale is obtained from the filter size. The smallest filter in
         * SURF has size 9 and corresponds to a scale of 1.2. Thus, the
         * scale of a filter with size X has a scale of X * 1.2 / 9.
         */
        int sample = static_cast<int>(kp.sample + 0.5f);
        descr.scale = 3 * kernel_sizes[kp.octave][sample] * 1.2f / 9.0f;

        /* Find the orientation of the keypoint. */
        if (!this->descriptor_orientation(&descr))
            continue;

        /* Compute descriptor relative to orientation. */
        if (!this->descriptor_computation(&descr,
            this->options.use_upright_descriptor))
            continue;

        this->descriptors.push_back(descr);
    }
}